

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  uint __line;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  string tmp;
  Slice user_start;
  pointer local_60;
  size_type sStack_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  Slice user_limit;
  
  tmp._M_dataplus._M_p = (start->_M_dataplus)._M_p;
  tmp._M_string_length = start->_M_string_length;
  user_start = ExtractUserKey((Slice *)&tmp);
  sVar2 = user_start.size_;
  pcVar3 = user_start.data_;
  user_limit = ExtractUserKey(limit);
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tmp,pcVar3,pcVar3 + sVar2);
  (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,&tmp,&user_limit);
  if (tmp._M_string_length < user_start.size_) {
    local_60 = tmp._M_dataplus._M_p;
    sStack_58 = tmp._M_string_length;
    iVar1 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&user_start);
    if (iVar1 < 0) {
      PutFixed64(&tmp,0xffffffffffffff01);
      local_60 = (start->_M_dataplus)._M_p;
      sStack_58 = start->_M_string_length;
      local_50 = tmp._M_dataplus._M_p._0_4_;
      uStack_4c = tmp._M_dataplus._M_p._4_4_;
      uStack_48 = (undefined4)tmp._M_string_length;
      uStack_44 = tmp._M_string_length._4_4_;
      iVar1 = (*(this->super_Comparator)._vptr_Comparator[2])(this);
      if (iVar1 < 0) {
        local_60 = tmp._M_dataplus._M_p;
        sStack_58 = tmp._M_string_length;
        iVar1 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_60,limit);
        if (iVar1 < 0) {
          std::__cxx11::string::swap((string *)start);
          goto LAB_0010d8a9;
        }
        pcVar3 = "this->Compare(tmp, limit) < 0";
        __line = 0x50;
      }
      else {
        pcVar3 = "this->Compare(*start, tmp) < 0";
        __line = 0x4f;
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.cc"
                    ,__line,
                    "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                   );
    }
  }
LAB_0010d8a9:
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}